

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShaderToolsCommon.cpp
# Opt level: O0

void Diligent::AppendShaderSourceLanguageDefinition(string *Source,SHADER_SOURCE_LANGUAGE Language)

{
  string local_38;
  SHADER_SOURCE_LANGUAGE local_14;
  string *psStack_10;
  SHADER_SOURCE_LANGUAGE Language_local;
  string *Source_local;
  
  local_14 = Language;
  psStack_10 = Source;
  std::__cxx11::string::operator+=((string *)Source,"/*");
  std::__cxx11::string::operator+=
            ((string *)psStack_10,(string *)ShaderSourceLanguageKey_abi_cxx11_);
  std::__cxx11::string::operator+=((string *)psStack_10,'=');
  std::__cxx11::to_string(&local_38,local_14);
  std::__cxx11::string::operator+=((string *)psStack_10,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::operator+=((string *)psStack_10,"*/");
  return;
}

Assistant:

void AppendShaderSourceLanguageDefinition(std::string& Source, SHADER_SOURCE_LANGUAGE Language)
{
    Source += "/*";
    Source += ShaderSourceLanguageKey;
    Source += '=';
    Source += std::to_string(static_cast<Uint32>(Language));
    Source += "*/";
}